

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdnsBlockTables::parse_map_item
          (cdnsBlockTables *this,uint8_t *old_in,uint8_t *in_max,int64_t val,int *err)

{
  char *local_4d0;
  char *local_4b8;
  int nb_e;
  char *e [8];
  char **ppcStack_440;
  int dump_err;
  char *p_out;
  char out_buf [1024];
  uint8_t *in;
  int *err_local;
  int64_t val_local;
  uint8_t *in_max_local;
  uint8_t *old_in_local;
  cdnsBlockTables *this_local;
  
  out_buf._1016_8_ = old_in;
  switch(val) {
  case 0:
    out_buf._1016_8_ = cbor_array_parse<cbor_bytes>(old_in,in_max,&this->addresses,err);
    break;
  case 1:
    out_buf._1016_8_ = cbor_array_parse<cdns_class_id>(old_in,in_max,&this->class_ids,err);
    break;
  case 2:
    out_buf._1016_8_ = cbor_array_parse<cbor_bytes>(old_in,in_max,&this->name_rdata,err);
    break;
  case 3:
    out_buf._1016_8_ =
         cbor_ctx_array_parse<cdns_query_signature,cdnsBlock>
                   (old_in,in_max,&this->q_sigs,err,this->current_block);
    break;
  case 4:
    out_buf._1016_8_ = cbor_array_parse<cdns_question_list>(old_in,in_max,&this->question_list,err);
    break;
  case 5:
    out_buf._1016_8_ = cbor_array_parse<cdns_question>(old_in,in_max,&this->qrr,err);
    break;
  case 6:
    out_buf._1016_8_ = cbor_array_parse<cdns_rr_list>(old_in,in_max,&this->rr_list,err);
    break;
  case 7:
    out_buf._1016_8_ = cbor_array_parse<cdns_rr_field>(old_in,in_max,&this->rrs,err);
    break;
  default:
    out_buf._1016_8_ = cbor_skip(old_in,in_max,err);
  }
  if (out_buf._1016_8_ == 0) {
    ppcStack_440 = &p_out;
    e[7]._4_4_ = 0;
    memcpy(&stack0xfffffffffffffb78,&PTR_anon_var_dwarf_20b73_0025a3c0,0x40);
    if ((val < 0) || (7 < val)) {
      local_4b8 = "unknown";
    }
    else {
      local_4b8 = *(char **)(&stack0xfffffffffffffb78 + val * 8);
    }
    fprintf(_stderr,"Cannot parse block table item %d (%s), err: %d\n",val & 0xffffffff,local_4b8,
            (ulong)(uint)*err);
    if ((val < 0) || (7 < val)) {
      local_4d0 = "unknown item";
    }
    else {
      local_4d0 = *(char **)(&stack0xfffffffffffffb78 + val * 8);
    }
    fprintf(_stderr,"Error %d parsing %s:\n",(ulong)(uint)*err,local_4d0);
    cbor_to_text(old_in,in_max,(char **)&stack0xfffffffffffffbc0,out_buf + 0x3f8,
                 (int *)((long)e + 0x3c));
    fprintf(_stderr,"%s\n",&p_out);
  }
  return (uint8_t *)out_buf._1016_8_;
}

Assistant:

uint8_t* cdnsBlockTables::parse_map_item(uint8_t* old_in, uint8_t const* in_max, int64_t val, int* err)
{
    uint8_t * in = old_in;

    switch (val) {
    case 0: // ip_address
        in = cbor_array_parse(in, in_max, &addresses, err);
        break;
    case 1: // classtype
        in = cbor_array_parse(in, in_max, &class_ids, err);
        break;
    case 2: // name_rdata
        in = cbor_array_parse(in, in_max, &name_rdata, err);
        break;
    case 3: // query_signature
        in = cbor_ctx_array_parse(in, in_max, &q_sigs, err, current_block);
        break;
    case 4: // question_list,
        in = cbor_array_parse(in, in_max, &question_list, err);
        break;
    case 5: // question_rr,
        in = cbor_array_parse(in, in_max, &qrr, err);
        break;
    case 6: // rr_list,
        in = cbor_array_parse(in, in_max, &rr_list, err);
        break;
    case 7: // rr,
        in = cbor_array_parse(in, in_max, &rrs, err);
        break;
    default:
        in = cbor_skip(in, in_max, err);
    }

    if (in == NULL) {
        char out_buf[1024];
        char* p_out = out_buf;
        int dump_err = 0;
        char const* e[] = { "ip_address", "classtype", "name_rdata", "query_signature", "question_list", "question_rr", "rr_list", "rr" };
        int nb_e = (int)sizeof(e) / sizeof(char const*);

        fprintf(stderr, "Cannot parse block table item %d (%s), err: %d\n", (int)val,
            (val >= 0 && val < nb_e) ? e[val] : "unknown", *err);

        fprintf(stderr, "Error %d parsing %s:\n", *err, (val >= 0 && val < nb_e) ? e[val] : "unknown item");
        (void)cbor_to_text(old_in, in_max, &p_out, out_buf + sizeof(out_buf), &dump_err);
        fprintf(stderr, "%s\n", out_buf);
    }

    return in;
}